

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoader.cpp
# Opt level: O2

void __thiscall MapLoader::~MapLoader(MapLoader *this)

{
  string *this_00;
  
  this->_vptr_MapLoader = (_func_int **)&PTR__MapLoader_0013aa90;
  this_00 = this->pMapFile;
  if (this_00 != (string *)0x0) {
    std::__cxx11::string::~string((string *)this_00);
  }
  operator_delete(this_00,0x20);
  return;
}

Assistant:

MapLoader::~MapLoader() {
    delete pMapFile;
}